

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TempInputTextScalar
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *p_data,char *format)

{
  ImGuiContext *pIVar1;
  char *format_00;
  bool bVar2;
  ImVec2 local_98;
  byte local_8d;
  uint local_8c;
  char local_88 [3];
  bool value_changed;
  ImGuiInputTextFlags flags;
  char data_buf [32];
  char fmt_buf [32];
  bool init;
  ImGuiContext *g;
  char *format_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  char *label_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  bVar2 = GImGui->TempInputTextId != id;
  if (bVar2) {
    ClearActiveID();
  }
  format_00 = ImParseFormatTrimDecorations(format,data_buf + 0x18,0x20);
  DataTypeFormatString(local_88,0x20,data_type,p_data,format_00);
  ImStrTrimBlanks(local_88);
  (pIVar1->CurrentWindow->DC).CursorPos = bb->Min;
  local_8c = 1;
  if (data_type == 8 || data_type == 9) {
    local_8c = 0x20000;
  }
  local_8c = local_8c | 0x200010;
  local_98 = ImRect::GetSize(bb);
  local_8d = InputTextEx(label,(char *)0x0,local_88,0x20,&local_98,local_8c,
                         (ImGuiInputTextCallback)0x0,(void *)0x0);
  if (bVar2) {
    if (pIVar1->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                    ,0xb2d,
                    "bool ImGui::TempInputTextScalar(const ImRect &, ImGuiID, const char *, ImGuiDataType, void *, const char *)"
                   );
    }
    pIVar1->TempInputTextId = pIVar1->ActiveId;
  }
  if (((bool)local_8d) &&
     (local_8d = DataTypeApplyOpFromText
                           (local_88,(pIVar1->InputTextState).InitialTextA.Data,data_type,p_data,
                            (char *)0x0), (bool)local_8d)) {
    MarkItemEdited(id);
  }
  return (bool)(local_8d & 1);
}

Assistant:

bool ImGui::TempInputTextScalar(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* p_data, const char* format)
{
    ImGuiContext& g = *GImGui;

    // On the first frame, g.TempInputTextId == 0, then on subsequent frames it becomes == id.
    // We clear ActiveID on the first frame to allow the InputText() taking it back.
    const bool init = (g.TempInputTextId != id);
    if (init)
        ClearActiveID();

    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, p_data, format);
    ImStrTrimBlanks(data_buf);

    g.CurrentWindow->DC.CursorPos = bb.Min;
    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited;
    flags |= ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = InputTextEx(label, NULL, data_buf, IM_ARRAYSIZE(data_buf), bb.GetSize(), flags);
    if (init)
    {
        // First frame we started displaying the InputText widget, we expect it to take the active id.
        IM_ASSERT(g.ActiveId == id);
        g.TempInputTextId = g.ActiveId;
    }
    if (value_changed)
    {
        value_changed = DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialTextA.Data, data_type, p_data, NULL);
        if (value_changed)
            MarkItemEdited(id);
    }
    return value_changed;
}